

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::solve_(DaTrie<false,_false,_false> *this,Query *query)

{
  byte bVar1;
  uint8_t label;
  uint32_t uVar2;
  reference pvVar3;
  size_t sVar4;
  size_t sVar5;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t base_1;
  uint32_t base;
  uint32_t child_pos;
  uint32_t _node_pos;
  Edge edges [2];
  size_t in_stack_fffffffffffffd38;
  Edge *pEVar6;
  Edge *in_stack_fffffffffffffd40;
  Edge *this_00;
  undefined4 in_stack_fffffffffffffd48;
  uint32_t in_stack_fffffffffffffd4c;
  Edge *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  Edge *local_258;
  Query *in_stack_fffffffffffffea8;
  Edge *in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  DaTrie<false,_false,_false> *in_stack_fffffffffffffec0;
  Edge local_120;
  undefined1 auStack_18 [24];
  
  local_258 = (Edge *)&stack0xfffffffffffffdd8;
  auStack_18._8_8_ = in_RSI;
  do {
    Edge::Edge(local_258);
    local_258 = local_258 + 1;
  } while (local_258 != (Edge *)auStack_18);
  Query::node_pos((Query *)auStack_18._8_8_);
  edge_((DaTrie<false,_false,_false> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
        in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  uVar2 = Query::node_pos((Query *)auStack_18._8_8_);
  pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
  uVar2 = Bc::base(pvVar3);
  bVar1 = Query::label((Query *)auStack_18._8_8_);
  if ((uVar2 ^ bVar1) != 0) {
    pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       (in_RDI,(ulong)(uVar2 ^ bVar1));
    Bc::check(pvVar3);
    edge_((DaTrie<false,_false,_false> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
          in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    sVar4 = Edge::size((Edge *)&stack0xfffffffffffffdd8);
    sVar5 = Edge::size(&local_120);
    if (sVar5 <= sVar4) {
      xcheck_((DaTrie<false,_false,_false> *)
              CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
              in_stack_fffffffffffffd50,
              (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      move_(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
            in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      goto LAB_00152762;
    }
  }
  label = Query::label((Query *)auStack_18._8_8_);
  pEVar6 = (Edge *)&stack0xfffffffffffffdd8;
  Edge::push(pEVar6,label);
  xcheck_((DaTrie<false,_false,_false> *)
          CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),pEVar6,
          (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
          CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  Edge::pop((Edge *)&stack0xfffffffffffffdd8);
  Query::node_pos((Query *)auStack_18._8_8_);
  move_(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
        in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
LAB_00152762:
  pEVar6 = (Edge *)&stack0xfffffffffffffdd8;
  this_00 = (Edge *)auStack_18;
  do {
    this_00 = this_00 + -1;
    Edge::~Edge(this_00);
  } while (this_00 != pEVar6);
  return;
}

Assistant:

void solve_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edges[2] = {};
    edge_(query.node_pos(), edges[0]);

    uint32_t _node_pos = 0;
    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (child_pos != 0) {
      _node_pos = bc_[child_pos].check();
      edge_(_node_pos, edges[1]);
    }

    if (child_pos == 0 || edges[0].size() < edges[1].size()) {
      edges[0].push(query.label());
      auto base = xcheck_(edges[0], blocks_);
      edges[0].pop();
      move_(query.node_pos(), base, edges[0], query);
    } else {
      auto base = xcheck_(edges[1], blocks_);
      move_(_node_pos, base, edges[1], query);
    }
  }